

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_decoders_controller.cc
# Opt level: O1

bool __thiscall
draco::SequentialAttributeDecodersController::TransformAttributesToOriginalFormat
          (SequentialAttributeDecodersController *this)

{
  __uniq_ptr_impl<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
  _Var1;
  PointAttribute *pPVar2;
  DracoOptions<draco::GeometryAttribute::Type> *this_00;
  bool bVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  undefined4 extraout_var;
  PointAttribute *src_att;
  undefined4 extraout_var_00;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  Type local_6c;
  string local_68;
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  *local_48;
  long local_40;
  ulong local_38;
  
  uVar5 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
            _vptr_AttributesDecoderInterface[6])();
  bVar9 = (int)uVar5 < 1;
  if (0 < (int)uVar5) {
    local_48 = &this->point_ids_;
    local_38 = (ulong)uVar5;
    local_40 = -local_38;
    uVar8 = 1;
    do {
      iVar6 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                _vptr_AttributesDecoderInterface[7])(this);
      if (*(long *)(CONCAT44(extraout_var,iVar6) + 0x50) == 0) {
LAB_0015f14a:
        _Var1._M_t.
        super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
        .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>._M_head_impl =
             (this->sequential_decoders_).
             super__Vector_base<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar8 - 1]._M_t.
             super___uniq_ptr_impl<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
             ._M_t;
        cVar4 = (**(code **)(*(long *)_Var1._M_t.
                                      super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
                                      .
                                      super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>
                                      ._M_head_impl + 0x30))
                          (_Var1._M_t.
                           super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
                           .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>.
                           _M_head_impl,local_48);
        if (cVar4 == '\0') {
          return bVar9;
        }
      }
      else {
        _Var1._M_t.
        super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
        .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>._M_head_impl =
             (this->sequential_decoders_).
             super__Vector_base<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar8 - 1]._M_t.
             super___uniq_ptr_impl<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
             ._M_t;
        pPVar2 = *(PointAttribute **)
                  ((long)_Var1._M_t.
                         super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
                         .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>.
                         _M_head_impl + 0x10);
        src_att = SequentialAttributeDecoder::GetPortableAttribute
                            ((SequentialAttributeDecoder *)
                             _Var1._M_t.
                             super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
                             .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>.
                             _M_head_impl);
        if (src_att == (PointAttribute *)0x0) {
          bVar3 = false;
        }
        else {
          iVar6 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                    _vptr_AttributesDecoderInterface[7])(this);
          this_00 = *(DracoOptions<draco::GeometryAttribute::Type> **)
                     (CONCAT44(extraout_var_00,iVar6) + 0x50);
          local_6c = (pPVar2->super_GeometryAttribute).attribute_type_;
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_68,"skip_attribute_transform","");
          bVar3 = DracoOptions<draco::GeometryAttribute::Type>::GetAttributeBool
                            (this_00,&local_6c,&local_68,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
        }
        if (bVar3 == false) goto LAB_0015f14a;
        PointAttribute::CopyFrom
                  (*(PointAttribute **)
                    ((long)(this->sequential_decoders_).
                           super__Vector_base<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar8 - 1]._M_t.
                           super___uniq_ptr_impl<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
                           ._M_t + 0x10),src_att);
      }
      bVar9 = local_38 <= uVar8;
      lVar7 = local_40 + uVar8;
      uVar8 = uVar8 + 1;
    } while (lVar7 != 0);
  }
  return bVar9;
}

Assistant:

bool SequentialAttributeDecodersController::
    TransformAttributesToOriginalFormat() {
  const int32_t num_attributes = GetNumAttributes();
  for (int i = 0; i < num_attributes; ++i) {
    // Check whether the attribute transform should be skipped.
    if (GetDecoder()->options()) {
      const PointAttribute *const attribute =
          sequential_decoders_[i]->attribute();
      const PointAttribute *const portable_attribute =
          sequential_decoders_[i]->GetPortableAttribute();
      if (portable_attribute &&
          GetDecoder()->options()->GetAttributeBool(
              attribute->attribute_type(), "skip_attribute_transform", false)) {
        // Attribute transform should not be performed. In this case, we replace
        // the output geometry attribute with the portable attribute.
        // TODO(ostava): We can potentially avoid this copy by introducing a new
        // mechanism that would allow to use the final attributes as portable
        // attributes for predictors that may need them.
        sequential_decoders_[i]->attribute()->CopyFrom(*portable_attribute);
        continue;
      }
    }
    if (!sequential_decoders_[i]->TransformAttributeToOriginalFormat(
            point_ids_)) {
      return false;
    }
  }
  return true;
}